

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

size_t intersect_accel<false,false,true>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  Vec<float,_3UL> *pVVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  Index IVar5;
  pointer pNVar6;
  pointer pPVar7;
  float fVar8;
  float fVar9;
  ulong uVar10;
  undefined8 uVar11;
  bool bVar12;
  byte bVar13;
  Index IVar14;
  size_t sVar15;
  long lVar16;
  uint uVar17;
  Index IVar18;
  size_t i;
  ulong uVar19;
  Index IVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  size_t local_1d8;
  undefined8 local_1c8;
  undefined4 local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  TraversalStats *local_188;
  Vec<float,_3UL> *local_180;
  undefined8 local_178;
  float local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  Type local_134 [64];
  uint local_34;
  
  uVar19 = *(ulong *)(ray->dir).values;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar19;
  auVar29._8_4_ = 0x7fffffff;
  auVar29._0_8_ = 0x7fffffff7fffffff;
  auVar29._12_4_ = 0x7fffffff;
  auVar30._8_4_ = 0x7f7fffff;
  auVar30._0_8_ = 0x7f7fffff7f7fffff;
  auVar30._12_4_ = 0x7f7fffff;
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  local_180 = &ray->dir;
  local_34 = 1;
  local_1d8 = 0xffffffffffffffff;
  auVar21 = vandps_avx(auVar25,auVar29);
  auVar22._8_4_ = 0x34000000;
  auVar22._0_8_ = 0x3400000034000000;
  auVar22._12_4_ = 0x34000000;
  uVar10 = vcmpps_avx512vl(auVar21,auVar22,6);
  uVar17 = vmovmskps_avx(auVar25);
  auVar21 = vpternlogd_avx512vl(auVar30,auVar25,auVar26,0xf8);
  local_1b0 = (ulong)((uVar17 & 1) * 4);
  local_1b8 = (ulong)((uVar17 & 1 ^ 1) << 2);
  bVar13 = (byte)(uVar10 >> 1);
  local_158._4_12_ = auVar21._4_12_;
  local_158._0_4_ =
       (float)((uint)((byte)uVar10 & 1) * (int)(1.0 / (float)uVar19) +
              (uint)!(bool)((byte)uVar10 & 1) * auVar21._0_4_);
  auVar21 = vmovshdup_avx(auVar25);
  auVar22 = vpternlogd_avx512vl(auVar30,auVar21,auVar26,0xf8);
  uVar17 = vmovmskps_avx(auVar21);
  local_1a0 = (ulong)(((uVar17 & 1) + 2) * 4);
  local_190 = (ulong)((uVar17 & 1 ^ 3) << 2);
  local_168._4_12_ = auVar22._4_12_;
  local_168._0_4_ =
       (float)((uint)(bVar13 & 1) * (int)(1.0 / auVar21._0_4_) +
              (uint)!(bool)(bVar13 & 1) * auVar22._0_4_);
  fVar4 = (ray->dir).values[2];
  auVar22 = ZEXT416((uint)fVar4);
  auVar21 = vandps_avx(auVar22,auVar29);
  uVar11 = vcmpss_avx512f(auVar21,ZEXT416(0x34000000),6);
  bVar12 = (bool)((byte)uVar11 & 1);
  fVar8 = -local_158._0_4_ * (ray->org).values[0];
  auVar21 = vpternlogd_avx512vl(auVar30,auVar22,auVar26,0xf8);
  uVar17 = vmovmskps_avx(auVar22);
  local_1a8 = (ulong)(((uVar17 & 1) + 4) * 4);
  local_198 = (ulong)((uVar17 & 1 ^ 5) << 2);
  local_148._4_12_ = auVar21._4_12_;
  local_148._0_4_ = (float)((uint)bVar12 * (int)(1.0 / fVar4) + (uint)!bVar12 * auVar21._0_4_);
  fVar4 = -local_168._0_4_ * (ray->org).values[1];
  fVar9 = -local_148._0_4_ * (ray->org).values[2];
  local_134[0] = (((accel->bvh).nodes.
                   super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->index).value;
  local_188 = stats;
  do {
    fVar24 = ray->tmin;
    fVar23 = ray->tmax;
    pNVar6 = (accel->bvh).nodes.
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar15 = local_188->visited_nodes;
LAB_00106421:
    local_34 = local_34 - 1;
    IVar18.value = local_134[local_34];
    uVar17 = IVar18.value & 0xf;
    if (uVar17 == 0) {
      do {
        uVar17 = IVar18.value >> 4;
        auVar21 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar17) + local_1b0)),
                                  ZEXT416((uint)fVar8),local_158);
        auVar22 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar17) + local_1a0)),
                                  ZEXT416((uint)fVar4),local_168);
        auVar25 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar17) + local_1b8)),
                                  ZEXT416((uint)fVar8),local_158);
        auVar26 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar17) + local_190)),
                                  ZEXT416((uint)fVar4),local_168);
        auVar29 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar17) + local_198)),
                                  ZEXT416((uint)fVar9),local_148);
        auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + uVar17) + local_1a8)),
                                  ZEXT416((uint)fVar9),local_148);
        auVar27 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar17 + 1) + local_190))
                                  ,ZEXT416((uint)fVar4),local_168);
        auVar21 = vmaxss_avx(auVar21,ZEXT416((uint)fVar24));
        auVar21 = vmaxss_avx(auVar22,auVar21);
        auVar22 = vminss_avx(auVar25,ZEXT416((uint)fVar23));
        auVar22 = vminss_avx(auVar26,auVar22);
        auVar21 = vmaxss_avx(auVar30,auVar21);
        auVar25 = vminss_avx(auVar29,auVar22);
        auVar26 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar17 + 1) + local_1a0))
                                  ,ZEXT416((uint)fVar4),local_168);
        auVar29 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar17 + 1) + local_1a8))
                                  ,ZEXT416((uint)fVar9),local_148);
        auVar22 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar17 + 1) + local_1b0))
                                  ,ZEXT416((uint)fVar8),local_158);
        auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar17 + 1) + local_1b8))
                                  ,ZEXT416((uint)fVar8),local_158);
        auVar22 = vmaxss_avx(auVar22,ZEXT416((uint)fVar24));
        auVar22 = vmaxss_avx(auVar26,auVar22);
        auVar26 = vminss_avx(auVar30,ZEXT416((uint)fVar23));
        auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar17 + 1) + local_198))
                                  ,ZEXT416((uint)fVar9),local_148);
        auVar26 = vminss_avx(auVar27,auVar26);
        auVar22 = vmaxss_avx(auVar29,auVar22);
        auVar26 = vminss_avx(auVar30,auVar26);
        fVar28 = auVar22._0_4_;
        if (auVar21._0_4_ <= auVar25._0_4_) {
          IVar18.value = ((Index *)((long)(pNVar6 + uVar17) + 0x18))->value;
          if (fVar28 <= auVar26._0_4_) {
            uVar19 = (ulong)local_34;
            if (0x3f < uVar19) {
              local_188->visited_nodes = sVar15 + 1;
              __assert_fail("!is_full()",
                            "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/stack.h"
                            ,0x15,
                            "void bvh::v2::SmallStack<bvh::v2::Index<32, 4>, 64>::push(const T &) [T = bvh::v2::Index<32, 4>, Capacity = 64]"
                           );
            }
            IVar5.value = ((Index *)((long)(pNVar6 + (ulong)uVar17 + 1) + 0x18))->value;
            IVar14.value = IVar5.value;
            IVar20.value = IVar18.value;
            if (auVar21._0_4_ <= fVar28) {
              IVar14.value = IVar18.value;
              IVar20.value = IVar5.value;
            }
            IVar18.value = IVar14.value;
            local_34 = local_34 + 1;
            local_134[uVar19] = IVar20.value;
          }
        }
        else {
          if (auVar26._0_4_ < fVar28) goto LAB_00106597;
          IVar18.value = ((Index *)((long)(pNVar6 + (ulong)uVar17 + 1) + 0x18))->value;
        }
        sVar15 = sVar15 + 1;
        uVar17 = IVar18.value & 0xf;
        if (uVar17 != 0) {
          local_188->visited_nodes = sVar15;
          break;
        }
      } while( true );
    }
    local_188->visited_leaves = local_188->visited_leaves + 1;
    uVar19 = (ulong)(IVar18.value >> 4);
    do {
      pPVar7 = (accel->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(ray->org).values;
      sVar15 = (accel->bvh).prim_ids.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar19];
      pVVar1 = &pPVar7[sVar15].n;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values;
      auVar22 = vsubps_avx(auVar21,auVar27);
      local_170 = (((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values[2] - (ray->org).values[2];
      local_178 = vmovlps_avx(auVar22);
      auVar21 = vmovshdup_avx(auVar22);
      fVar24 = (ray->dir).values[2];
      fVar23 = (ray->dir).values[0];
      fVar28 = (ray->dir).values[1];
      auVar25 = vfmsub231ss_fma(ZEXT416((uint)(auVar21._0_4_ * fVar24)),ZEXT416((uint)fVar28),
                                ZEXT416((uint)local_170));
      auVar26 = vfmsub231ss_fma(ZEXT416((uint)(local_170 * fVar23)),auVar22,ZEXT416((uint)fVar24));
      auVar22 = vfmsub231ss_fma(ZEXT416((uint)(auVar22._0_4_ * fVar28)),ZEXT416((uint)fVar23),
                                auVar21);
      auVar21 = vinsertps_avx(auVar25,auVar26,0x10);
      local_1c8 = vmovlps_avx(auVar21);
      local_1c0 = auVar22._0_4_;
      fVar23 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,pVVar1,pPVar7 + sVar15 + 1,local_180);
      fVar24 = 0.0;
      lVar16 = 0;
      do {
        pfVar2 = (float *)((long)&local_1c8 + lVar16);
        pfVar3 = (float *)((long)pPVar7[sVar15].e2.values + lVar16);
        lVar16 = lVar16 + 4;
        fVar24 = fVar24 + *pfVar2 * *pfVar3;
      } while (lVar16 != 0xc);
      fVar28 = 0.0;
      lVar16 = 0;
      do {
        pfVar2 = (float *)((long)&local_1c8 + lVar16);
        pfVar3 = (float *)((long)pPVar7[sVar15].e1.values + lVar16);
        lVar16 = lVar16 + 4;
        fVar28 = fVar28 + *pfVar2 * *pfVar3;
      } while (lVar16 != 0xc);
      fVar23 = 1.0 / fVar23;
      if (((-1.1920929e-07 <= fVar23 * fVar24) && (-1.1920929e-07 <= fVar23 * fVar28)) &&
         (-1.1920929e-07 <= (1.0 - fVar23 * fVar24) - fVar23 * fVar28)) {
        fVar24 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,pVVar1,pPVar7 + sVar15 + 1,&local_178);
        fVar24 = fVar24 * fVar23;
        if ((ray->tmin <= fVar24) && (fVar24 <= ray->tmax)) {
          ray->tmax = fVar24;
          local_1d8 = sVar15;
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar17 + (IVar18.value >> 4));
    if (local_34 == 0) {
      return local_1d8;
    }
  } while( true );
LAB_00106597:
  sVar15 = sVar15 + 1;
  local_188->visited_nodes = sVar15;
  if (local_34 == 0) {
    return local_1d8;
  }
  goto LAB_00106421;
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}